

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall
CConnman::CConnman(CConnman *this,uint64_t nSeed0In,uint64_t nSeed1In,AddrMan *addrman_in,
                  NetGroupManager *netgroupman,CChainParams *params,bool network_active)

{
  long lVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  CConnman *this_00;
  CConnman *this_01;
  CConnman *this_02;
  undefined8 in_R8;
  undefined8 in_R9;
  long in_FS_OFFSET;
  Options connOptions;
  Options *in_stack_fffffffffffffd88;
  undefined1 flag;
  undefined1 active;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AnnotatedMixin<std::mutex>::AnnotatedMixin
            ((AnnotatedMixin<std::mutex> *)in_stack_fffffffffffffd88);
  std::atomic<unsigned_long>::atomic((atomic<unsigned_long> *)in_stack_fffffffffffffd88,0x21b2e1);
  *(undefined8 *)(in_RDI + 0x30) = 0;
  *(undefined8 *)(in_RDI + 0x38) = 0;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffd88,(int *)0x21b315);
  std::vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>::vector
            ((vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_> *)
             in_stack_fffffffffffffd88);
  std::vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>::vector
            ((vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_> *)
             in_stack_fffffffffffffd88);
  *(undefined4 *)(in_RDI + 0x88) = 0;
  *(undefined4 *)(in_RDI + 0x8c) = 0;
  std::vector<CConnman::ListenSocket,_std::allocator<CConnman::ListenSocket>_>::vector
            ((vector<CConnman::ListenSocket,_std::allocator<CConnman::ListenSocket>_> *)
             in_stack_fffffffffffffd88);
  std::atomic<bool>::atomic((atomic<bool> *)in_stack_fffffffffffffd88,false);
  *(undefined1 *)(in_RDI + 0xa9) = 0;
  *(undefined8 *)(in_RDI + 0xb0) = in_RCX;
  *(undefined8 *)(in_RDI + 0xb8) = in_R8;
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_fffffffffffffd88);
  AnnotatedMixin<std::mutex>::AnnotatedMixin
            ((AnnotatedMixin<std::mutex> *)in_stack_fffffffffffffd88);
  std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>::vector
            ((vector<AddedNodeParams,_std::allocator<AddedNodeParams>_> *)in_stack_fffffffffffffd88)
  ;
  AnnotatedMixin<std::mutex>::AnnotatedMixin
            ((AnnotatedMixin<std::mutex> *)in_stack_fffffffffffffd88);
  std::vector<CNode_*,_std::allocator<CNode_*>_>::vector
            ((vector<CNode_*,_std::allocator<CNode_*>_> *)in_stack_fffffffffffffd88);
  std::__cxx11::list<CNode_*,_std::allocator<CNode_*>_>::list
            ((list<CNode_*,_std::allocator<CNode_*>_> *)in_stack_fffffffffffffd88);
  AnnotatedMixin<std::recursive_mutex>::AnnotatedMixin
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffd88);
  std::atomic<long>::atomic((atomic<long> *)in_stack_fffffffffffffd88,0x21b496);
  *(undefined4 *)(in_RDI + 0x1d8) = 0;
  *(undefined8 *)(in_RDI + 0x1e8) = 0;
  *(undefined8 *)(in_RDI + 0x1f0) = 0;
  *(undefined8 *)(in_RDI + 0x1dc) = 0;
  *(undefined8 *)(in_RDI + 0x1e4) = 0;
  std::
  map<unsigned_long,_CConnman::CachedAddrResponse,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CConnman::CachedAddrResponse>_>_>
  ::map((map<unsigned_long,_CConnman::CachedAddrResponse,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CConnman::CachedAddrResponse>_>_>
         *)in_stack_fffffffffffffd88);
  std::atomic<ServiceFlags>::atomic((atomic<ServiceFlags> *)in_stack_fffffffffffffd88);
  std::unique_ptr<CSemaphore,std::default_delete<CSemaphore>>::
  unique_ptr<std::default_delete<CSemaphore>,void>
            ((unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_> *)in_stack_fffffffffffffd88);
  std::unique_ptr<CSemaphore,std::default_delete<CSemaphore>>::
  unique_ptr<std::default_delete<CSemaphore>,void>
            ((unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_> *)in_stack_fffffffffffffd88);
  *(undefined4 *)(in_RDI + 0x24c) = 8;
  *(undefined4 *)(in_RDI + 0x250) = 1;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffffd88);
  *(undefined8 *)(in_RDI + 0x290) = in_RSI;
  *(undefined8 *)(in_RDI + 0x298) = in_RDX;
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 0x2a8));
  AnnotatedMixin<std::mutex>::AnnotatedMixin
            ((AnnotatedMixin<std::mutex> *)in_stack_fffffffffffffd88);
  std::atomic<bool>::atomic((atomic<bool> *)in_stack_fffffffffffffd88,false);
  CThreadInterrupt::CThreadInterrupt((CThreadInterrupt *)in_stack_fffffffffffffd88);
  flag = (undefined1)((ulong)(in_RDI + 0x368) >> 0x38);
  std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>::
  unique_ptr<std::default_delete<i2p::sam::Session>,void>
            ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
             in_stack_fffffffffffffd88);
  this_00 = (CConnman *)(in_RDI + 0x370);
  std::thread::thread((thread *)in_stack_fffffffffffffd88);
  std::thread::thread((thread *)in_stack_fffffffffffffd88);
  this_01 = (CConnman *)(in_RDI + 0x380);
  std::thread::thread((thread *)in_stack_fffffffffffffd88);
  this_02 = (CConnman *)(in_RDI + 0x388);
  std::thread::thread((thread *)in_stack_fffffffffffffd88);
  std::thread::thread((thread *)in_stack_fffffffffffffd88);
  std::thread::thread((thread *)in_stack_fffffffffffffd88);
  std::atomic<bool>::atomic((atomic<bool> *)in_stack_fffffffffffffd88);
  std::atomic<bool>::atomic((atomic<bool> *)in_stack_fffffffffffffd88,false);
  std::vector<CService,_std::allocator<CService>_>::vector
            ((vector<CService,_std::allocator<CService>_> *)in_stack_fffffffffffffd88);
  active = (undefined1)((ulong)(in_RDI + 0x3c8) >> 0x38);
  AnnotatedMixin<std::mutex>::AnnotatedMixin
            ((AnnotatedMixin<std::mutex> *)in_stack_fffffffffffffd88);
  std::
  queue<std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>,std::deque<std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>,std::allocator<std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>>>>
  ::
  queue<std::deque<std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>,std::allocator<std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>>>,void>
            ((queue<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::deque<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>_>
              *)in_stack_fffffffffffffd88);
  AnnotatedMixin<std::mutex>::AnnotatedMixin
            ((AnnotatedMixin<std::mutex> *)in_stack_fffffffffffffd88);
  std::__cxx11::list<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>::list
            ((list<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_> *)
             in_stack_fffffffffffffd88);
  *(undefined8 *)(in_RDI + 0x480) = in_R9;
  SetTryNewOutboundPeer(this_00,(bool)flag);
  Options::Options(in_stack_fffffffffffffd88);
  Init(this_02,(Options *)this_01);
  SetNetworkActive(this_01,(bool)active);
  Options::~Options(in_stack_fffffffffffffd88);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CConnman::CConnman(uint64_t nSeed0In, uint64_t nSeed1In, AddrMan& addrman_in,
                   const NetGroupManager& netgroupman, const CChainParams& params, bool network_active)
    : addrman(addrman_in)
    , m_netgroupman{netgroupman}
    , nSeed0(nSeed0In)
    , nSeed1(nSeed1In)
    , m_params(params)
{
    SetTryNewOutboundPeer(false);

    Options connOptions;
    Init(connOptions);
    SetNetworkActive(network_active);
}